

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O1

Vec_Wec_t * Abc_NtkDetectFinClasses(Abc_Ntk_t *pNtk,int fVerbose)

{
  Abc_NtkFunc_t AVar1;
  int iVar2;
  void *pvVar3;
  Abc_Ntk_t *pNtk_00;
  uint uVar4;
  char *pcVar5;
  Vec_Wec_t *__ptr;
  Vec_Int_t *vCis;
  int *piVar6;
  Vec_Int_t *vNodes;
  Vec_Wec_t *vMap2;
  Vec_Wec_t *vResult;
  Vec_Int_t *pVVar7;
  Vec_Int_t *vList;
  uint uVar8;
  size_t __nmemb;
  char *__format;
  ulong uVar9;
  long lVar10;
  Vec_Int_t *vCos;
  long lVar11;
  Vec_Int_t *local_b8;
  Vec_Wec_t *vCoSets;
  Vec_Wec_t *vMap;
  Vec_Int_t *local_78;
  Vec_Int_t *local_70;
  Vec_Wec_t *local_68;
  Vec_Wec_t *local_60;
  ulong local_58;
  Vec_Int_t *local_50;
  Abc_Ntk_t *local_48;
  Vec_Int_t *local_40;
  ulong local_38;
  
  if (pNtk->vFins == (Vec_Int_t *)0x0) {
    puts("Current network does not have the required info.");
    return (Vec_Wec_t *)0x0;
  }
  AVar1 = pNtk->ntkFunc;
  if (((AVar1 != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_LOGIC)) &&
     ((AVar1 != ABC_FUNC_MAP || (pNtk->ntkType != ABC_NTK_LOGIC)))) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk) || Abc_NtkIsMappedLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                  ,0x47d,"Vec_Wec_t *Abc_NtkDetectFinClasses(Abc_Ntk_t *, int)");
  }
  if ((AVar1 == ABC_FUNC_SOP) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    uVar4 = Abc_NtkFinCheckTypesOk(pNtk);
    if (uVar4 == 0) {
      local_b8 = Abc_NtkFinComputeTypes(pNtk);
LAB_002aa532:
      local_50 = pNtk->vFins;
      local_78 = Abc_NtkFinComputeObjects(local_50,&vMap,pNtk->vObjs->nSize);
      __ptr = Abc_NtkDetectObjClasses(pNtk,local_78,&vCoSets);
      vCis = (Vec_Int_t *)malloc(0x10);
      vCis->nCap = 1000;
      vCis->nSize = 0;
      piVar6 = (int *)malloc(4000);
      vCis->pArray = piVar6;
      vNodes = (Vec_Int_t *)malloc(0x10);
      vNodes->nCap = 1000;
      vNodes->nSize = 0;
      piVar6 = (int *)malloc(4000);
      vNodes->pArray = piVar6;
      uVar4 = pNtk->vObjs->nSize;
      vMap2 = (Vec_Wec_t *)malloc(0x10);
      uVar8 = 8;
      if (6 < uVar4 - 1) {
        uVar8 = uVar4;
      }
      vMap2->nSize = 0;
      vMap2->nCap = uVar8;
      local_48 = pNtk;
      if (uVar8 == 0) {
        local_70 = (Vec_Int_t *)0x0;
      }
      else {
        local_70 = (Vec_Int_t *)calloc((long)(int)uVar8,0x10);
      }
      vMap2->pArray = local_70;
      vMap2->nSize = uVar4;
      vResult = (Vec_Wec_t *)malloc(0x10);
      vResult->nCap = 1000;
      vResult->nSize = 0;
      pVVar7 = (Vec_Int_t *)calloc(1000,0x10);
      vResult->pArray = pVVar7;
      local_58 = (ulong)__ptr->nSize;
      if (0 < (long)local_58) {
        pVVar7 = __ptr->pArray;
        lVar10 = 4;
        local_68 = vMap;
        uVar9 = 0;
        local_60 = vCoSets;
        do {
          pNtk_00 = local_48;
          local_38 = uVar9;
          if ((long)local_60->nSize <= (long)uVar9) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                          ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          local_40 = local_60->pArray;
          vCos = (Vec_Int_t *)((long)local_40 + lVar10 + -4);
          Abc_NtkFinMiterCollect(local_48,vCos,vCis,vNodes);
          vList = Abc_NtkFinCreateList(local_68,pVVar7);
          uVar4 = Abc_NtkFinRefinement
                            (pNtk_00,local_b8,vCos,vCis,vNodes,local_50,vList,vMap2,vResult);
          uVar9 = local_38;
          if (fVerbose != 0) {
            printf("Group %4d :  Obj =%4d. Fins =%4d.  CI =%5d. CO =%5d. Node =%6d.  SAT calls =%5d.\n"
                   ,local_38 & 0xffffffff,(ulong)(uint)pVVar7->nSize,(ulong)(uint)vList->nSize,
                   (ulong)(uint)vCis->nSize,(ulong)*(uint *)((long)&local_40->nCap + lVar10),
                   (ulong)(uint)vNodes->nSize,(ulong)uVar4);
          }
          if (vList->pArray != (int *)0x0) {
            free(vList->pArray);
            vList->pArray = (int *)0x0;
          }
          if (vList != (Vec_Int_t *)0x0) {
            free(vList);
          }
          uVar9 = uVar9 + 1;
          pVVar7 = pVVar7 + 1;
          lVar10 = lVar10 + 0x10;
        } while (local_58 != uVar9);
      }
      __nmemb = (size_t)vResult->nSize;
      if (0 < (long)__nmemb) {
        pVVar7 = vResult->pArray;
        lVar10 = 0;
        do {
          qsort(*(void **)((long)&pVVar7->pArray + lVar10),
                (long)*(int *)((long)&pVVar7->nSize + lVar10),4,Vec_IntSortCompare1);
          lVar10 = lVar10 + 0x10;
        } while (__nmemb << 4 != lVar10);
      }
      qsort(vResult->pArray,__nmemb,0x10,Vec_WecSortCompare3);
      pVVar7 = local_78;
      if (local_b8 != (Vec_Int_t *)0x0) {
        if (local_b8->pArray != (int *)0x0) {
          free(local_b8->pArray);
          local_b8->pArray = (int *)0x0;
        }
        free(local_b8);
      }
      if (pVVar7->pArray != (int *)0x0) {
        free(pVVar7->pArray);
        pVVar7->pArray = (int *)0x0;
      }
      if (pVVar7 != (Vec_Int_t *)0x0) {
        free(pVVar7);
      }
      iVar2 = __ptr->nCap;
      if (0 < (long)iVar2) {
        pVVar7 = __ptr->pArray;
        lVar10 = 0;
        do {
          pvVar3 = *(void **)((long)&pVVar7->pArray + lVar10);
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
            *(undefined8 *)((long)&pVVar7->pArray + lVar10) = 0;
          }
          lVar10 = lVar10 + 0x10;
        } while ((long)iVar2 * 0x10 != lVar10);
      }
      if (__ptr->pArray != (Vec_Int_t *)0x0) {
        free(__ptr->pArray);
        __ptr->pArray = (Vec_Int_t *)0x0;
      }
      __ptr->nCap = 0;
      __ptr->nSize = 0;
      free(__ptr);
      if (0 < vMap->nCap) {
        lVar10 = 8;
        lVar11 = 0;
        do {
          pvVar3 = *(void **)((long)&vMap->pArray->nCap + lVar10);
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
            *(undefined8 *)((long)&vMap->pArray->nCap + lVar10) = 0;
          }
          lVar11 = lVar11 + 1;
          lVar10 = lVar10 + 0x10;
        } while (lVar11 < vMap->nCap);
      }
      if (vMap->pArray != (Vec_Int_t *)0x0) {
        free(vMap->pArray);
        vMap->pArray = (Vec_Int_t *)0x0;
      }
      vMap->nCap = 0;
      vMap->nSize = 0;
      free(vMap);
      pVVar7 = local_70;
      if (0 < (int)uVar8) {
        lVar10 = 0;
        do {
          pvVar3 = *(void **)((long)&pVVar7->pArray + lVar10);
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
            *(undefined8 *)((long)&pVVar7->pArray + lVar10) = 0;
          }
          lVar10 = lVar10 + 0x10;
        } while ((ulong)uVar8 << 4 != lVar10);
      }
      if (pVVar7 != (Vec_Int_t *)0x0) {
        free(pVVar7);
        vMap2->pArray = (Vec_Int_t *)0x0;
      }
      vMap2->nCap = 0;
      vMap2->nSize = 0;
      free(vMap2);
      if (0 < vCoSets->nCap) {
        lVar10 = 8;
        lVar11 = 0;
        do {
          pvVar3 = *(void **)((long)&vCoSets->pArray->nCap + lVar10);
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
            *(undefined8 *)((long)&vCoSets->pArray->nCap + lVar10) = 0;
          }
          lVar11 = lVar11 + 1;
          lVar10 = lVar10 + 0x10;
        } while (lVar11 < vCoSets->nCap);
      }
      if (vCoSets->pArray != (Vec_Int_t *)0x0) {
        free(vCoSets->pArray);
        vCoSets->pArray = (Vec_Int_t *)0x0;
      }
      vCoSets->nCap = 0;
      vCoSets->nSize = 0;
      free(vCoSets);
      if (vCis->pArray != (int *)0x0) {
        free(vCis->pArray);
        vCis->pArray = (int *)0x0;
      }
      free(vCis);
      if (vNodes->pArray != (int *)0x0) {
        free(vNodes->pArray);
        vNodes->pArray = (int *)0x0;
      }
      free(vNodes);
      return vResult;
    }
    if (((int)uVar4 < 0) || (pNtk->vObjs->nSize <= (int)uVar4)) {
LAB_002aaa95:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pcVar5 = Abc_ObjName((Abc_Obj_t *)pNtk->vObjs->pArray[uVar4]);
    __format = "Current network contains unsupported gate types (for example, see node \"%s\").\n";
  }
  else {
    if ((AVar1 != ABC_FUNC_MAP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                    ,0x491,"Vec_Wec_t *Abc_NtkDetectFinClasses(Abc_Ntk_t *, int)");
    }
    uVar4 = Abc_NtkFinCheckTypesOk2(pNtk);
    if (uVar4 == 0) {
      local_b8 = (Vec_Int_t *)0x0;
      goto LAB_002aa532;
    }
    if (((int)uVar4 < 0) || (pNtk->vObjs->nSize <= (int)uVar4)) goto LAB_002aaa95;
    pcVar5 = Abc_ObjName((Abc_Obj_t *)pNtk->vObjs->pArray[uVar4]);
    __format = 
    "Current network has mismatch between mapped gate size and fault gate size (for example, see node \"%s\").\n"
    ;
  }
  printf(__format,pcVar5);
  return (Vec_Wec_t *)0x0;
}

Assistant:

Vec_Wec_t * Abc_NtkDetectFinClasses( Abc_Ntk_t * pNtk, int fVerbose )
{
    Vec_Int_t * vTypes = NULL; // gate types
    Vec_Int_t * vPairs;        // original info as a set of pairs (ObjId, TypeId)
    Vec_Int_t * vObjs;         // all those objects that have some fin 
    Vec_Wec_t * vMap;          // for each object, the set of fins
    Vec_Wec_t * vMap2;         // for each local object, the set of pairs (Info, Index)
    Vec_Wec_t * vClasses;      // classes of objects
    Vec_Wec_t * vCoSets;       // corresponding CO sets
    Vec_Int_t * vClass;        // one class
    Vec_Int_t * vCoSet;        // one set of COs
    Vec_Int_t * vCiSet;        // one set of CIs
    Vec_Int_t * vNodeSet;      // one set of nodes
    Vec_Int_t * vList;         // one info list
    Vec_Wec_t * vResult;       // resulting equivalences
    int i, iObj, nCalls;
    if ( pNtk->vFins == NULL )
    {
        printf( "Current network does not have the required info.\n" );
        return NULL;
    }
    assert( Abc_NtkIsSopLogic(pNtk) || Abc_NtkIsMappedLogic(pNtk) );
    if ( Abc_NtkIsSopLogic(pNtk) )
    {
        iObj = Abc_NtkFinCheckTypesOk(pNtk);
        if ( iObj )
        {
            printf( "Current network contains unsupported gate types (for example, see node \"%s\").\n", Abc_ObjName(Abc_NtkObj(pNtk, iObj)) );
            return NULL;
        }
        vTypes   = Abc_NtkFinComputeTypes( pNtk );
    }
    else if ( Abc_NtkIsMappedLogic(pNtk) )
    {
        iObj = Abc_NtkFinCheckTypesOk2(pNtk);
        if ( iObj )
        {
            printf( "Current network has mismatch between mapped gate size and fault gate size (for example, see node \"%s\").\n", Abc_ObjName(Abc_NtkObj(pNtk, iObj)) );
            return NULL;
        }
    }
    else assert( 0 );
    //Abc_NtkFrameExtend( pNtk );
    // collect data
    vPairs   = pNtk->vFins;
    vObjs    = Abc_NtkFinComputeObjects( vPairs, &vMap, Abc_NtkObjNumMax(pNtk) );
    vClasses = Abc_NtkDetectObjClasses( pNtk, vObjs, &vCoSets );
    // refine classes
    vCiSet   = Vec_IntAlloc( 1000 );
    vNodeSet = Vec_IntAlloc( 1000 );
    vMap2    = Vec_WecStart( Abc_NtkObjNumMax(pNtk) );
    vResult  = Vec_WecAlloc( 1000 );
    Vec_WecForEachLevel( vClasses, vClass, i )
    {
        // extract one window
        vCoSet = Vec_WecEntry( vCoSets, i );
        Abc_NtkFinMiterCollect( pNtk, vCoSet, vCiSet, vNodeSet );
        // refine one class
        vList = Abc_NtkFinCreateList( vMap, vClass );
        nCalls = Abc_NtkFinRefinement( pNtk, vTypes, vCoSet, vCiSet, vNodeSet, vPairs, vList, vMap2, vResult );
        if ( fVerbose )
            printf( "Group %4d :  Obj =%4d. Fins =%4d.  CI =%5d. CO =%5d. Node =%6d.  SAT calls =%5d.\n", 
                i, Vec_IntSize(vClass), Vec_IntSize(vList), Vec_IntSize(vCiSet), Vec_IntSize(vCoSet), Vec_IntSize(vNodeSet), nCalls );
        Vec_IntFree( vList );
    }
    // sort entries in each array
    Vec_WecForEachLevel( vResult, vClass, i )
        Vec_IntSort( vClass, 0 );
    // sort by the index of the first entry
    Vec_WecSortByFirstInt( vResult, 0 ); 
    // cleanup
    Vec_IntFreeP( & vTypes );
    Vec_IntFree( vObjs );
    Vec_WecFree( vClasses );
    Vec_WecFree( vMap );
    Vec_WecFree( vMap2 );
    Vec_WecFree( vCoSets );
    Vec_IntFree( vCiSet );
    Vec_IntFree( vNodeSet );
    return vResult;
}